

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  size_t sVar1;
  char *__s;
  allocator local_29;
  char *local_28 [2];
  
  __s = "unknown file";
  if (this != (internal *)0x0) {
    __s = (char *)this;
  }
  if ((int)file < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,(internal *)__s + sVar1);
  }
  else {
    String::Format((char *)local_28,"%s:%d",__s,(ulong)file & 0xffffffff);
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_28[0],&local_29);
    if (local_28[0] != (char *)0x0) {
      operator_delete__(local_28[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0)
    return file_name;
  else
    return String::Format("%s:%d", file_name, line).c_str();
}